

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

AEStackFrame __thiscall moira::Moira::makeFrame<96ul>(Moira *this,u32 addr)

{
  u32 uVar1;
  u32 in_ESI;
  Moira *in_RDI;
  AEStackFrame AVar2;
  u32 in_stack_ffffffffffffffd8;
  u32 uVar3;
  
  uVar3 = in_ESI;
  uVar1 = getPC(in_RDI);
  getSR((Moira *)0x2e75a2);
  getIRD(in_RDI);
  AVar2 = makeFrame<96ul>((Moira *)CONCAT44(uVar3,uVar1),in_ESI,in_stack_ffffffffffffffd8,
                          (u16)((ulong)in_RDI >> 0x30),(u16)((ulong)in_RDI >> 0x20));
  return AVar2;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame <F> (addr, getPC(), getSR(), getIRD());
}